

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

int fft_segment_fwd(mixed_segment *segment)

{
  undefined4 *puVar1;
  float fVar2;
  uint n;
  uint uVar3;
  undefined8 *puVar4;
  long lVar5;
  float *pSrc;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t size;
  ulong uVar10;
  double dVar11;
  double __x;
  uint32_t out_samples;
  uint32_t in_samples;
  float *out;
  float *in;
  uint local_98;
  uint32_t local_94;
  long local_90;
  ulong local_88;
  ulong local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  float *local_58;
  float *local_50;
  double local_48;
  undefined8 uStack_40;
  
  puVar4 = (undefined8 *)segment->data;
  n = *(uint *)((long)puVar4 + 0x14);
  uVar9 = (ulong)n;
  uVar3 = *(uint *)(puVar4 + 3);
  lVar5 = puVar4[5];
  pSrc = (float *)puVar4[6];
  lVar6 = puVar4[7];
  local_94 = 0xffffffff;
  mixed_buffer_request_read(&local_50,&local_94,(mixed_buffer *)*puVar4);
  size = 0;
  uVar10 = uVar9 / uVar3;
  if (puVar4[4] == 0) {
    puVar4[4] = uVar9 - uVar10;
  }
  if (local_94 != 0) {
    local_78 = (double)uVar9;
    local_68 = (double)*(uint *)(puVar4 + 2) / local_78;
    local_60 = ((double)uVar10 * 6.283185307179586) / local_78;
    local_70 = (double)uVar3;
    uVar8 = 0;
    size = local_94;
    local_90 = uVar9 - uVar10;
    local_88 = uVar10;
    do {
      lVar7 = puVar4[4];
      *(float *)(lVar5 + lVar7 * 4) = local_50[uVar8];
      lVar7 = lVar7 + 1;
      puVar4[4] = lVar7;
      if ((long)uVar9 <= lVar7) {
        local_98 = n;
        local_80 = uVar8;
        mixed_buffer_clear((mixed_buffer *)puVar4[1]);
        mixed_buffer_request_write(&local_58,&local_98,(mixed_buffer *)puVar4[1]);
        puVar4[4] = local_90;
        if (n != 0) {
          uVar10 = 0;
          do {
            dVar11 = cos(((double)(long)uVar10 * 6.283185307179586) / local_78);
            pSrc[uVar10 * 2] =
                 (float)((double)*(float *)(lVar5 + uVar10 * 4) * (dVar11 * -0.5 + 0.5));
            pSrc[uVar10 * 2 + 1] = 0.0;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        spiral_fft_float(n,-1,pSrc,pSrc);
        lVar7 = 0;
        do {
          __x = (double)pSrc[lVar7 * 2];
          dVar11 = (double)pSrc[lVar7 * 2 + 1];
          local_48 = SQRT(__x * __x + dVar11 * dVar11);
          local_48 = local_48 + local_48;
          uStack_40 = 0;
          dVar11 = atan2(dVar11,__x);
          fVar2 = *(float *)(lVar6 + lVar7 * 4);
          *(float *)(lVar6 + lVar7 * 4) = (float)dVar11;
          dVar11 = (dVar11 - (double)fVar2) - (double)lVar7 * local_60;
          uVar8 = (ulong)(dVar11 / 3.141592653589793);
          uVar10 = uVar8 & 0xfffffffffffffffe;
          if (-1 < (long)uVar8) {
            uVar10 = ((uint)uVar8 & 1) + uVar8;
          }
          *(ulong *)(local_58 + lVar7 * 2) =
               CONCAT44((float)local_48,
                        (float)((double)lVar7 * local_68 +
                               ((((double)(long)uVar10 * -3.141592653589793 + dVar11) * local_70) /
                               6.283185307179586) * local_68));
          lVar7 = lVar7 + 1;
        } while ((ulong)(n >> 1) + 1 != lVar7);
        mixed_buffer_finish_write(local_98,(mixed_buffer *)puVar4[1]);
        uVar8 = local_80;
        size = local_94;
        if (0 < local_90) {
          lVar7 = 0;
          do {
            puVar1 = (undefined4 *)(lVar5 + lVar7 * 4);
            *puVar1 = puVar1[local_88];
            lVar7 = lVar7 + 1;
          } while (lVar7 < local_90);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < size);
  }
  mixed_buffer_finish_read(size,(mixed_buffer *)*puVar4);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_fwd(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict in_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->phase;

  float *restrict in, *restrict out;
  uint32_t in_samples = UINT32_MAX;
  mixed_buffer_request_read(&in, &in_samples, data->in);

  double magnitude, phase, tmp, window, real, imag;
  long i, k, qpd;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  for(i=0; i<in_samples; i++){
    in_fifo[data->overlap] = in[i];
    data->overlap++;
    if(data->overlap >= framesize){
      uint32_t out_samples = framesize;
      mixed_buffer_clear(data->out);
      mixed_buffer_request_write(&out, &out_samples, data->out);
      
      data->overlap = fifo_latency;

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        fft_workspace[2*k] = in_fifo[k] * window;
        fft_workspace[2*k+1] = 0.;
      }

      spiral_fft_float(framesize, -1, fft_workspace, fft_workspace);

      for(k=0; k<=framesize2; k++){
        real = fft_workspace[2*k];
        imag = fft_workspace[2*k+1];
        magnitude = 2.*sqrt(real*real + imag*imag);
        phase = atan2(imag,real);
        
        tmp = phase - last_phase[k];
        last_phase[k] = phase;
        tmp -= (double)k*expected;

        qpd = tmp/M_PI;
        if (qpd >= 0) qpd += qpd&1;
        else qpd -= qpd&1;
        tmp -= M_PI*(double)qpd;

        tmp = oversampling*tmp/(2.*M_PI);
        tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

        out[k*2] = tmp;
        out[k*2+1] = magnitude;
      }
      mixed_buffer_finish_write(out_samples, data->out);
      
      for (k = 0; k < fifo_latency; k++) in_fifo[k] = in_fifo[k+step];
    }
  }
  
  mixed_buffer_finish_read(in_samples, data->in);
  return 1;
}